

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O2

void __thiscall gdsForge::gdsText(gdsForge *this,gdsTEXT *in_TEXT,bool minimal)

{
  undefined7 in_register_00000011;
  int data [1];
  undefined8 local_80;
  bitset<16UL> bits;
  string local_70;
  string local_50;
  
  GDSwriteRec(this,0xc00);
  if ((int)CONCAT71(in_register_00000011,minimal) == 0) {
    data[0] = in_TEXT->plex;
    GDSwriteInt(this,0x2f03,data,1);
  }
  data[0] = in_TEXT->layer;
  GDSwriteInt(this,0xd02,data,1);
  data[0] = in_TEXT->text_type;
  GDSwriteInt(this,0x1602,data,1);
  bits.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  GDSwriteBitArr(this,0x1701,(bitset<16UL>)0x0);
  data[0] = in_TEXT->width;
  GDSwriteInt(this,0xf03,data,1);
  std::bitset<16UL>::set(&bits,2,(bool)(-(in_TEXT->scale != 1.0) & 1));
  std::bitset<16UL>::set(&bits,1,(bool)(-(in_TEXT->angle != 0.0) & 1));
  GDSwriteBitArr(this,0x1a01,bits);
  local_80._0_4_ = in_TEXT->xCor;
  local_80._4_4_ = in_TEXT->yCor;
  GDSwriteInt(this,0x1003,(int *)&local_80,2);
  std::__cxx11::string::string((string *)&local_50,(string *)&in_TEXT->textbody);
  GDSwriteStr(this,0x1906,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (!minimal) {
    data[0] = in_TEXT->propattr;
    GDSwriteInt(this,0x2b02,data,1);
    std::__cxx11::string::string((string *)&local_70,(string *)&in_TEXT->propvalue);
    GDSwriteStr(this,0x2c06,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  GDSwriteRec(this,0x1100);
  return;
}

Assistant:

void gdsForge::gdsText(const gdsTEXT &in_TEXT, bool minimal)
{
  int data[1];
  this->GDSwriteRec(GDS_TEXT);

  // ELFLAGS and PLEX are optional
  if (minimal == false) {
    data[0] = in_TEXT.plex;
    this->GDSwriteInt(GDS_PLEX, data, 1);
  }

  // Layer number, 0 to 63
  data[0] = in_TEXT.layer;
  this->GDSwriteInt(GDS_LAYER, data, 1);

  data[0] = in_TEXT.text_type;
  this->GDSwriteInt(GDS_TEXTTYPE, data, 1);

  // PRESENTATION; PATHTYPE, WIDTH, STRANS, MAG, and ANGLE are optional
  bitset<16> bits;

  // this->GDSwriteBitArr(GDS_PRESENTATION, presentation_flags);
  this->GDSwriteBitArr(GDS_PRESENTATION, bits);

  data[0] = in_TEXT.width;
  this->GDSwriteInt(GDS_WIDTH, data, 1);

  // magnification, default 1
  if (in_TEXT.scale == 1)
    bits.set(2, 0);
  else
    bits.set(2, 1);

  // angle of rotation
  if (in_TEXT.angle == 0)
    bits.set(1, 0);
  else
    bits.set(1, 1);

  this->GDSwriteBitArr(GDS_STRANS, bits);

  int corXY[2];
  corXY[0] = in_TEXT.xCor;
  corXY[1] = in_TEXT.yCor;
  this->GDSwriteInt(GDS_XY, corXY, 2);

  // text/string to be used of the structure that is referenced
  this->GDSwriteStr(GDS_STRING, in_TEXT.textbody);

  // Optional goodies
  if (minimal == false) { // false
    data[0] = in_TEXT.propattr;
    this->GDSwriteInt(GDS_PROPATTR, data, 1);
    this->GDSwriteStr(GDS_PROPVALUE, in_TEXT.propvalue);
  }

  this->GDSwriteRec(GDS_ENDEL);
}